

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O0

bool __thiscall RootIndexProxyModel::canFetchMore(RootIndexProxyModel *this,QModelIndex *parent)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  long *plVar4;
  QPersistentModelIndex local_70;
  QModelIndex local_68;
  undefined1 local_50 [24];
  QModelIndex sourceParent;
  RootIndexProxyModelPrivate *d;
  QModelIndex *parent_local;
  RootIndexProxyModel *this_local;
  
  lVar3 = QAbstractProxyModel::sourceModel();
  if (lVar3 == 0) {
    this_local._7_1_ = false;
  }
  else {
    sourceParent.m = (QAbstractItemModel *)d_func(this);
    QModelIndex::QModelIndex((QModelIndex *)(local_50 + 0x10));
    bVar1 = QModelIndex::isValid(parent);
    if (bVar1) {
      (**(code **)(*(long *)this + 400))(&local_68.m,this,parent);
      local_50._16_8_ = local_68.m;
      sourceParent.r = local_50._0_4_;
      sourceParent.c = local_50._4_4_;
      sourceParent.i = local_50._8_8_;
    }
    else {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70);
      local_50._16_8_ = local_70.d;
      sourceParent.r = local_68.r;
      sourceParent.c = local_68.c;
      sourceParent.i = local_68.i;
    }
    plVar4 = (long *)QAbstractProxyModel::sourceModel();
    bVar2 = (**(code **)(*plVar4 + 0x130))(plVar4,local_50 + 0x10);
    this_local._7_1_ = (bool)(bVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool RootIndexProxyModel::canFetchMore(const QModelIndex &parent) const
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (!sourceModel())
        return false;
    Q_D(const RootIndexProxyModel);
    QModelIndex sourceParent;
    if (parent.isValid())
        sourceParent = mapToSource(parent);
    else
        sourceParent = d->m_rootIndex;
    return sourceModel()->canFetchMore(sourceParent);
}